

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_money.cpp
# Opt level: O2

int money_curr_eq(money_t *m1,money_t *m2)

{
  uint uVar1;
  int iVar2;
  char *__s1;
  char *__s2;
  
  if (m1 != m2) {
    uVar1 = 0;
    if ((m1 != (money_t *)0x0 || m2 == (money_t *)0x0) &&
       (m1 == (money_t *)0x0 || m2 != (money_t *)0x0)) {
      __s1 = money___currency(m1);
      __s2 = money___currency(m2);
      iVar2 = strcmp(__s1,__s2);
      uVar1 = (uint)(iVar2 == 0);
    }
    return uVar1;
  }
  return 1;
}

Assistant:

static int
money_curr_eq(money_t const *m1, money_t const *m2)
{
    int is_eq =0;

    /* Simple case */
    if ( m1 == m2 )
    {
        return 1;
    }
    /* If money1 XOR money2 are NULL, then we kick out. */
    else if ( (m1 == NULL && m2 != NULL) || (m1 != NULL && m2 == NULL) )
    {
        return 0;
    }

    is_eq =strcmp(money___currency(m1), money___currency(m2)) ==0;

    return is_eq;
}